

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O3

double __thiscall NEST::LArNEST::GetNRElectronYields(LArNEST *this,double energy,double efield)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  
  dVar3 = (this->fNR).gamma;
  dVar1 = pow(efield,(this->fNR).delta);
  dVar2 = (this->fNR).epsilon + energy;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  auVar4._8_8_ = dVar2;
  auVar4._0_8_ = dVar1 * dVar3;
  auVar4 = divpd(_DAT_001179a0,auVar4);
  dVar3 = pow(energy / (this->fNR).zeta,(this->fNR).eta);
  return (1.0 - 1.0 / (dVar3 + 1.0)) * auVar4._8_8_ * auVar4._0_8_;
}

Assistant:

double LArNEST::GetNRElectronYields(double energy, double efield) {
  return (1.0 / (fNR.gamma * pow(efield, fNR.delta))) *
         (1.0 / sqrt(energy + fNR.epsilon)) *
         (1.0 - 1.0 / (1.0 + pow(energy / fNR.zeta, fNR.eta)));
}